

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::reportSchemaError
          (TraverseSchema *this,DOMElement *elem,XMLCh *msgDomain,int errorCode,XMLCh *text1,
          XMLCh *text2,XMLCh *text3,XMLCh *text4)

{
  XSDLocator::setValues
            (this->fLocator,this->fSchemaInfo->fCurrentSchemaURL,(XMLCh *)0x0,
             (XMLFileLoc)elem[0x16].super_DOMNode._vptr_DOMNode,
             (XMLFileLoc)elem[0x17].super_DOMNode._vptr_DOMNode);
  XSDErrorReporter::emitError
            (&this->fXSDErrorReporter,errorCode,msgDomain,&this->fLocator->super_Locator,text1,text2
             ,text3,text4,this->fMemoryManager);
  return;
}

Assistant:

void TraverseSchema::reportSchemaError(const DOMElement* const elem,
                                       const XMLCh* const msgDomain,
                                       const int errorCode,
                                       const XMLCh* const text1,
                                       const XMLCh* const text2,
                                       const XMLCh* const text3,
                                       const XMLCh* const text4) {

    fLocator->setValues(fSchemaInfo->getCurrentSchemaURL(), 0,
                        ((XSDElementNSImpl*) elem)->getLineNo(),
                        ((XSDElementNSImpl*) elem)->getColumnNo());

    fXSDErrorReporter.emitError(errorCode, msgDomain, fLocator, text1, text2, text3, text4, fMemoryManager);
}